

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool __thiscall CField::step(CField *this,pos_t *b,SState *s,path_t *path)

{
  size_t *psVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  _List_node_base *p_Var6;
  iterator iVar7;
  mapped_type *pmVar8;
  priority_list_t *ppVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  _Self __tmp;
  _List_node_base *p_Var13;
  _List_node_base *local_50;
  _List_node_base *local_48;
  _List_node_base local_40;
  
  ppVar9 = &this->prio;
  if (s->inverted != false) {
    ppVar9 = &this->inv_prio;
  }
  p_Var13 = (ppVar9->super__List_base<CField::EPriority,_std::allocator<CField::EPriority>_>).
            _M_impl._M_node.super__List_node_base._M_next;
  bVar4 = false;
  bVar5 = false;
  do {
    iVar10 = b->first;
    iVar11 = b->second;
    switch(s->direction) {
    case EP_SOUTH:
      iVar11 = iVar11 + 1;
      break;
    case EP_EAST:
      iVar10 = iVar10 + 1;
      break;
    case EP_NORTH:
      iVar11 = iVar11 + -1;
      break;
    case EP_WEST:
      iVar10 = iVar10 + -1;
    }
    lVar12 = (long)iVar11;
    iVar2 = *(int *)(*(long *)&(this->field).
                               super__Vector_base<std::vector<CField::ECell,_std::allocator<CField::ECell>_>,_std::allocator<std::vector<CField::ECell,_std::allocator<CField::ECell>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar10].
                               super__Vector_base<CField::ECell,_std::allocator<CField::ECell>_>.
                               _M_impl.super__Vector_impl_data + lVar12 * 4);
    if ((iVar2 == 0x23) || ((iVar2 == 0x58 && (s->drunken == false)))) {
      p_Var6 = p_Var13 + 1;
      p_Var13 = p_Var13->_M_next;
      s->direction = *(EPriority *)&p_Var6->_M_next;
    }
    else {
      switch(s->direction) {
      case EP_SOUTH:
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"SOUTH","");
        p_Var6 = (_List_node_base *)operator_new(0x30);
        break;
      case EP_EAST:
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"EAST","");
        p_Var6 = (_List_node_base *)operator_new(0x30);
        break;
      case EP_NORTH:
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"NORTH","");
        p_Var6 = (_List_node_base *)operator_new(0x30);
        break;
      case EP_WEST:
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"WEST","");
        p_Var6 = (_List_node_base *)operator_new(0x30);
        break;
      default:
        goto switchD_00104a58_default;
      }
      p_Var6[1]._M_next = p_Var6 + 2;
      if (local_50 == &local_40) {
        p_Var6[2]._M_next =
             (_List_node_base *)CONCAT71(local_40._M_next._1_7_,local_40._M_next._0_1_);
        p_Var6[2]._M_prev = local_40._M_prev;
      }
      else {
        p_Var6[1]._M_next = local_50;
        p_Var6[2]._M_next =
             (_List_node_base *)CONCAT71(local_40._M_next._1_7_,local_40._M_next._0_1_);
      }
      p_Var6[1]._M_prev = local_48;
      local_48 = (_List_node_base *)0x0;
      local_40._M_next._0_1_ = 0;
      local_50 = &local_40;
      std::__detail::_List_node_base::_M_hook(p_Var6);
      psVar1 = &(path->
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(local_40._M_next._1_7_,local_40._M_next._0_1_) + 1);
      }
switchD_00104a58_default:
      b->first = iVar10;
      b->second = iVar11;
      lVar3 = *(long *)&(this->field).
                        super__Vector_base<std::vector<CField::ECell,_std::allocator<CField::ECell>_>,_std::allocator<std::vector<CField::ECell,_std::allocator<CField::ECell>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar10].
                        super__Vector_base<CField::ECell,_std::allocator<CField::ECell>_>._M_impl.
                        super__Vector_impl_data;
      bVar5 = true;
      if ((*(int *)(lVar3 + lVar12 * 4) == 0x58) && (s->drunken == true)) {
        *(undefined4 *)(lVar3 + lVar12 * 4) = 0x20;
        bVar4 = true;
        bVar5 = true;
      }
    }
    if (bVar5) {
      iVar10 = *(int *)(*(long *)&(this->field).
                                  super__Vector_base<std::vector<CField::ECell,_std::allocator<CField::ECell>_>,_std::allocator<std::vector<CField::ECell,_std::allocator<CField::ECell>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[b->first].
                                  super__Vector_base<CField::ECell,_std::allocator<CField::ECell>_>.
                                  _M_impl.super__Vector_impl_data + (long)b->second * 4);
      if (iVar10 < 0x4e) {
        if (iVar10 == 0x42) {
          s->drunken = (bool)(s->drunken ^ 1);
        }
        else if (iVar10 == 0x45) {
          s->direction = EP_EAST;
        }
        else if (iVar10 == 0x49) {
          s->inverted = (bool)(s->inverted ^ 1);
        }
      }
      else {
        switch(iVar10) {
        case 0x4e:
          s->direction = EP_NORTH;
          break;
        case 0x53:
          s->direction = EP_SOUTH;
          break;
        case 0x54:
          iVar7 = std::
                  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  ::find(&(this->teleport)._M_t,b);
          if (&(this->teleport)._M_t._M_impl.super__Rb_tree_header ==
              (_Rb_tree_header *)iVar7._M_node) {
            __assert_fail("teleport.end() != i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/medium/bender/main.cpp"
                          ,0x140,"bool CField::step(pos_t &, SState &, path_t &)");
          }
          pmVar8 = std::
                   map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                   ::operator[](&this->teleport,b);
          b->first = pmVar8->first;
          b->second = pmVar8->second;
          break;
        case 0x57:
          s->direction = EP_WEST;
        }
      }
      return bVar4;
    }
  } while( true );
}

Assistant:

bool step(pos_t& b, SState& s, path_t& path)
        {
            bool result = false;
            bool step_taken = false;
            priority_list_t::const_iterator i = s.inverted ? inv_prio.begin() : prio.begin();
            
            do
            {
                int tx = b.first;
                int ty = b.second;
                
                switch (s.direction)
                {
                    case EP_EAST:
                        tx++;
                        break;
                        
                    case EP_NORTH:
                        ty--;
                        break;
                        
                    case EP_WEST:
                        tx--;
                        break;
                        
                    case EP_SOUTH:
                        ty++;
                        break;
                }
                if (EC_WALL == field[tx][ty]
                    || (EC_OBSTACLE == field[tx][ty] && !s.drunken))
                {
                    s.direction = *(i++);
                } else
                {
                    step_taken = true;
                    switch (s.direction)
                    {
                        case EP_EAST:
                            path.push_back("EAST");
                            break;
                            
                        case EP_NORTH:
                            path.push_back("NORTH");
                            break;
                            
                        case EP_WEST:
                            path.push_back("WEST");
                            break;
                            
                        case EP_SOUTH:
                            path.push_back("SOUTH");
                            break;
                    }
                    //std::cerr << path.back() << " (" << tx << ", " << ty << ")" << std::endl;
                    b = pos_t(tx, ty);
                    if (EC_OBSTACLE == field[tx][ty] && s.drunken)
                    {
                        field[tx][ty] = EC_NONE;
                        //s.drunken = false;
                        result = true;
                    }
                }
            } while (!step_taken);
            
            switch (field[b.first][b.second])
            {
                case EC_BEER:
                    s.drunken = !s.drunken;
                    break;
                    
                case EC_INVERTOR:
                    s.inverted = !s.inverted;
                    break;
                    
                case EC_TELEPORT:
                {
                    teleport_t::const_iterator i = teleport.find(b);
                    assert(teleport.end() != i);
                    b = teleport[b];
                    break;
                }
                    
                case EC_SOUTH:
                    s.direction = EP_SOUTH;
                    break;
                    
                case EC_EAST:
                    s.direction = EP_EAST;
                    break;
                    
                case EC_NORTH:
                    s.direction = EP_NORTH;
                    break;
                    
                case EC_WEST:
                    s.direction = EP_WEST;
                    break;

                default:
                    /* do nothing */;
            }
            return result;
        }